

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

bool __thiscall testing::TestSuite::Passed(TestSuite *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = failed_test_count(this);
  if (iVar2 < 1) {
    bVar1 = TestResult::Failed(&this->ad_hoc_test_result_);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Failed() const {
    return failed_test_count() > 0 || ad_hoc_test_result().Failed();
  }